

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O0

void cmime_message_set_boundary(CMimeMessage_T *message,char *boundary)

{
  char *pcVar1;
  char *local_28;
  char *nl;
  char *s;
  char *boundary_local;
  CMimeMessage_T *message_local;
  
  nl = (char *)0x0;
  s = boundary;
  boundary_local = (char *)message;
  if (message == (CMimeMessage_T *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x2df,"void cmime_message_set_boundary(CMimeMessage_T *, const char *)");
  }
  if (boundary != (char *)0x0) {
    if (message->boundary != (char *)0x0) {
      free(message->boundary);
    }
    pcVar1 = strdup(s);
    *(char **)(boundary_local + 0x18) = pcVar1;
    if (*(long *)(boundary_local + 0x30) == 0) {
      local_28 = "\r\n";
    }
    else {
      local_28 = *(char **)(boundary_local + 0x30);
    }
    asprintf(&nl,"multipart/mixed;%s\tboundary=\"%s\"",local_28,
             *(undefined8 *)(boundary_local + 0x18));
    _cmime_internal_set_linked_header_value
              (*(CMimeList_T **)(boundary_local + 0x10),"Content-Type",nl);
    _rebuild_first_part((CMimeMessage_T *)boundary_local);
    free(nl);
    return;
  }
  __assert_fail("boundary",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                ,0x2e0,"void cmime_message_set_boundary(CMimeMessage_T *, const char *)");
}

Assistant:

void cmime_message_set_boundary(CMimeMessage_T *message, const char *boundary) {
    char *s = NULL;
    char *nl = NULL;

    assert(message);
    assert(boundary);
    
    if (message->boundary != NULL)
        free(message->boundary);
        
    message->boundary = strdup(boundary);

    if (message->linebreak)
        nl = message->linebreak;
    else
        nl = CRLF;
    
    asprintf(&s,"multipart/mixed;%s\tboundary=\"%s\"",nl,message->boundary);
    _cmime_internal_set_linked_header_value(message->headers,"Content-Type",s);

    _rebuild_first_part(message);
    free(s);
}